

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS ref_iso_boom_header(FILE **file_ptr,REF_INT ldim,char **scalar_names,char *filename)

{
  FILE *__s;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  __s = fopen(filename,"w");
  *file_ptr = (FILE *)__s;
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    __s = (FILE *)*file_ptr;
    if (__s == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x31c,
             "ref_iso_boom_header","unable to open file");
      return 2;
    }
  }
  fwrite("title=\"tecplot refine gather\"\n",0x1e,1,__s);
  fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,(FILE *)*file_ptr);
  if (scalar_names == (char **)0x0) {
    if (0 < ldim) {
      uVar1 = 1;
      do {
        fprintf((FILE *)*file_ptr," \"V%d\"",(ulong)uVar1);
        bVar3 = uVar1 != ldim;
        uVar1 = uVar1 + 1;
      } while (bVar3);
    }
  }
  else if (0 < ldim) {
    uVar2 = 0;
    do {
      fprintf((FILE *)*file_ptr," \"%s\"",scalar_names[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)ldim != uVar2);
  }
  fputc(10,(FILE *)*file_ptr);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_header(FILE **file_ptr, REF_INT ldim,
                                       const char **scalar_names,
                                       const char *filename) {
  REF_INT i;
  *file_ptr = fopen(filename, "w");
  if (NULL == ((void *)*file_ptr)) printf("unable to open %s\n", filename);
  RNS(*file_ptr, "unable to open file");
  fprintf(*file_ptr, "title=\"tecplot refine gather\"\n");
  fprintf(*file_ptr, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"V%d\"", i + 1);
  }
  fprintf(*file_ptr, "\n");

  return REF_SUCCESS;
}